

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O0

vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *
vkt::tessellation::generateReferenceTriangleTessCoords
          (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
           *__return_storage_ptr__,SpacingMode spacingMode,int inner,int outer0,int outer1,
          int outer2)

{
  Vector<float,_3> local_128;
  Vector<float,_3> local_11c;
  value_type local_110;
  int local_104;
  float local_100;
  int j;
  float f;
  int i_3;
  Vec3 corners [3];
  float maxUVW;
  float minUVW;
  int local_c0;
  int local_bc;
  int curInnerTriangleLevel;
  int innerTriangleNdx;
  int numInnerTriangles;
  float local_a8;
  int local_a4;
  float v_2;
  int i_2;
  float local_94;
  int local_90;
  float v_1;
  int i_1;
  float local_80;
  int local_7c;
  float v;
  int i;
  Vector<float,_3> local_68 [2];
  Vector<float,_3> local_4c;
  undefined1 local_40 [8];
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> tessCoords;
  int outer2_local;
  int outer1_local;
  int outer0_local;
  int inner_local;
  SpacingMode spacingMode_local;
  
  tessCoords.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = outer2;
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_40);
  if (inner == 1) {
    if (((outer0 == 1) && (outer1 == 1)) &&
       (tessCoords.
        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == 1)) {
      tcu::Vector<float,_3>::Vector(&local_4c,1.0,0.0,0.0);
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_40,
                 &local_4c);
      tcu::Vector<float,_3>::Vector(local_68,0.0,1.0,0.0);
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_40,
                 local_68);
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&i,0.0,0.0,1.0);
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_40,
                 (value_type *)&i);
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
                (__return_storage_ptr__,
                 (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_40)
      ;
    }
    else {
      generateReferenceTriangleTessCoords
                (__return_storage_ptr__,spacingMode,spacingMode == SPACINGMODE_FRACTIONAL_ODD | 2,
                 outer0,outer1,
                 tessCoords.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    }
  }
  else {
    for (local_7c = 0; local_7c < outer0; local_7c = local_7c + 1) {
      local_80 = (float)local_7c / (float)outer0;
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&v_1,0.0,local_80,1.0 - local_80);
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_40,
                 (value_type *)&v_1);
    }
    for (local_90 = 0; local_90 < outer1; local_90 = local_90 + 1) {
      local_94 = (float)local_90 / (float)outer1;
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&v_2,1.0 - local_94,0.0,local_94);
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_40,
                 (value_type *)&v_2);
    }
    for (local_a4 = 0;
        local_a4 <
        tessCoords.
        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_; local_a4 = local_a4 + 1) {
      local_a8 = (float)local_a4 /
                 (float)tessCoords.
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      tcu::Vector<float,_3>::Vector
                ((Vector<float,_3> *)&innerTriangleNdx,local_a8,1.0 - local_a8,0.0);
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_40,
                 (value_type *)&innerTriangleNdx);
    }
    curInnerTriangleLevel = inner / 2;
    for (local_bc = 0; local_bc < curInnerTriangleLevel; local_bc = local_bc + 1) {
      local_c0 = inner + (local_bc + 1) * -2;
      if (local_c0 == 0) {
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&maxUVW,0.33333334);
        std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                  ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                   local_40,(value_type *)&maxUVW);
      }
      else {
        corners[2].m_data[2] = (float)(local_bc * 2 + 2) / (float)(inner * 3);
        corners[2].m_data[1] = 1.0 - (corners[2].m_data[2] + corners[2].m_data[2]);
        tcu::Vector<float,_3>::Vector
                  ((Vector<float,_3> *)&f,corners[2].m_data[1],corners[2].m_data[2],
                   corners[2].m_data[2]);
        tcu::Vector<float,_3>::Vector
                  ((Vector<float,_3> *)(corners[0].m_data + 1),corners[2].m_data[2],
                   corners[2].m_data[1],corners[2].m_data[2]);
        tcu::Vector<float,_3>::Vector
                  ((Vector<float,_3> *)(corners[1].m_data + 1),corners[2].m_data[2],
                   corners[2].m_data[2],corners[2].m_data[1]);
        for (j = 0; j < local_c0; j = j + 1) {
          local_100 = (float)j / (float)local_c0;
          for (local_104 = 0; local_104 < 3; local_104 = local_104 + 1) {
            tcu::operator*((tcu *)&local_11c,1.0 - local_100,
                           (Vector<float,_3> *)(&f + (long)local_104 * 3));
            tcu::operator*((tcu *)&local_128,local_100,
                           (Vector<float,_3> *)
                           (&f + (long)(local_104 + 1 + ((local_104 + 1) / 3) * -3) * 3));
            tcu::operator+((tcu *)&local_110,&local_11c,&local_128);
            std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                      ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                       local_40,&local_110);
          }
        }
      }
    }
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
              (__return_storage_ptr__,
               (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_40);
  }
  v = 1.4013e-45;
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<tcu::Vec3> generateReferenceTriangleTessCoords (const SpacingMode	spacingMode,
															const int			inner,
															const int			outer0,
															const int			outer1,
															const int			outer2)
{
	std::vector<tcu::Vec3> tessCoords;

	if (inner == 1)
	{
		if (outer0 == 1 && outer1 == 1 && outer2 == 1)
		{
			tessCoords.push_back(tcu::Vec3(1.0f, 0.0f, 0.0f));
			tessCoords.push_back(tcu::Vec3(0.0f, 1.0f, 0.0f));
			tessCoords.push_back(tcu::Vec3(0.0f, 0.0f, 1.0f));
			return tessCoords;
		}
		else
			return generateReferenceTriangleTessCoords(spacingMode, spacingMode == SPACINGMODE_FRACTIONAL_ODD ? 3 : 2,
													   outer0, outer1, outer2);
	}
	else
	{
		for (int i = 0; i < outer0; i++) { const float v = (float)i / (float)outer0; tessCoords.push_back(tcu::Vec3(    0.0f,        v, 1.0f - v)); }
		for (int i = 0; i < outer1; i++) { const float v = (float)i / (float)outer1; tessCoords.push_back(tcu::Vec3(1.0f - v,     0.0f,        v)); }
		for (int i = 0; i < outer2; i++) { const float v = (float)i / (float)outer2; tessCoords.push_back(tcu::Vec3(       v, 1.0f - v,     0.0f)); }

		const int numInnerTriangles = inner/2;
		for (int innerTriangleNdx = 0; innerTriangleNdx < numInnerTriangles; innerTriangleNdx++)
		{
			const int curInnerTriangleLevel = inner - 2*(innerTriangleNdx+1);

			if (curInnerTriangleLevel == 0)
				tessCoords.push_back(tcu::Vec3(1.0f/3.0f));
			else
			{
				const float		minUVW		= (float)(2 * (innerTriangleNdx + 1)) / (float)(3 * inner);
				const float		maxUVW		= 1.0f - 2.0f*minUVW;
				const tcu::Vec3	corners[3]	=
				{
					tcu::Vec3(maxUVW, minUVW, minUVW),
					tcu::Vec3(minUVW, maxUVW, minUVW),
					tcu::Vec3(minUVW, minUVW, maxUVW)
				};

				for (int i = 0; i < curInnerTriangleLevel; i++)
				{
					const float f = (float)i / (float)curInnerTriangleLevel;
					for (int j = 0; j < 3; j++)
						tessCoords.push_back((1.0f - f)*corners[j] + f*corners[(j+1)%3]);
				}
			}
		}

		return tessCoords;
	}
}